

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O2

Query * queryparse::transform(Query *__return_storage_ptr__,node *n)

{
  type_info *ptVar1;
  undefined8 *puVar2;
  uint32_t count;
  runtime_error *this;
  pointer puVar3;
  vector<Query,_std::allocator<Query>_> local_98;
  Query local_78;
  
  do {
    ptVar1 = (n->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.id_;
    if (((ptVar1 == (type_info *)&hexstring::typeinfo) ||
        (ptVar1 == (type_info *)&plaintext::typeinfo)) ||
       (ptVar1 == (type_info *)&wide_plaintext::typeinfo)) {
      transform_qstring((QString *)&local_78,n);
      Query::Query(__return_storage_ptr__,(QString *)&local_78);
      Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::~vector
                ((vector<QToken,_std::allocator<QToken>_> *)&local_78);
      return __return_storage_ptr__;
    }
    if (ptVar1 == (type_info *)&min_of_expr::typeinfo) {
      tao::pegtl::parse_tree::default_node_content::content_abi_cxx11_
                ((string *)&local_78,
                 (default_node_content *)
                 (*(long *)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                           super_default_node_children<tao::pegtl::parse_tree::node>.children.
                           super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x18));
      count = std::__cxx11::stoi((string *)&local_78,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_78);
      puVar3 = (n->super_basic_node<tao::pegtl::parse_tree::node>).
               super_default_node_children<tao::pegtl::parse_tree::node>.children.
               super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      while (puVar3 = puVar3 + 1,
            puVar3 != (n->super_basic_node<tao::pegtl::parse_tree::node>).
                      super_default_node_children<tao::pegtl::parse_tree::node>.children.
                      super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        transform(&local_78,
                  (puVar3->_M_t).
                  super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
                  .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl);
        Catch::clara::std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  (&local_98,&local_78);
        Query::~Query(&local_78);
      }
      Query::Query(__return_storage_ptr__,count,(vector<Query,_std::allocator<Query>_> *)&local_98);
LAB_00172af1:
      Catch::clara::std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
      return __return_storage_ptr__;
    }
    if (ptVar1 != (type_info *)&expression::typeinfo) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"encountered unexpected node");
LAB_00172b25:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar2 = &(((n->super_basic_node<tao::pegtl::parse_tree::node>).
                super_default_node_children<tao::pegtl::parse_tree::node>.children.
                super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
              super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
              ._M_t.
              super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
              .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl;
    if ((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
              super_default_node_children<tao::pegtl::parse_tree::node>.children.
              super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 != 8) {
      if (*(pointer_____offset_0x10___ **)(puVar2[1] + 0x18) == &op_or::typeinfo) {
        local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        transform(&local_78,(node *)*puVar2);
        Catch::clara::std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  (&local_98,&local_78);
        Query::~Query(&local_78);
        transform(&local_78,
                  *(node **)((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                                   super_default_node_children<tao::pegtl::parse_tree::node>.
                                   children.
                                   super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x10));
        Catch::clara::std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  (&local_98,&local_78);
        Query::~Query(&local_78);
        local_78.type = OR;
        Query::Query(__return_storage_ptr__,&local_78.type,
                     (vector<Query,_std::allocator<Query>_> *)&local_98);
      }
      else {
        if (*(pointer_____offset_0x10___ **)(puVar2[1] + 0x18) != &op_and::typeinfo) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"encountered unexpected expression");
          goto LAB_00172b25;
        }
        local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        transform(&local_78,(node *)*puVar2);
        Catch::clara::std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  (&local_98,&local_78);
        Query::~Query(&local_78);
        transform(&local_78,
                  *(node **)((long)(n->super_basic_node<tao::pegtl::parse_tree::node>).
                                   super_default_node_children<tao::pegtl::parse_tree::node>.
                                   children.
                                   super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x10));
        Catch::clara::std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  (&local_98,&local_78);
        Query::~Query(&local_78);
        local_78.type = AND;
        Query::Query(__return_storage_ptr__,&local_78.type,
                     (vector<Query,_std::allocator<Query>_> *)&local_98);
      }
      goto LAB_00172af1;
    }
    n = (node *)*puVar2;
  } while( true );
}

Assistant:

Query transform(const parse_tree::node &n) {
    if (n.is<plaintext>() || n.is<wide_plaintext>() || n.is<hexstring>()) {
        return Query(transform_qstring(n));
    }
    if (n.is<min_of_expr>()) {
        auto &count = n.children[0];
        uint32_t counti;

        try {
            counti = std::stoi(count->content());
        } catch (std::out_of_range &e) {
            throw std::runtime_error(
                "number N is out of range in 'min N of (...)' expression");
        }

        auto it = n.children.cbegin() + 1;
        std::vector<Query> subq;
        for (; it != n.children.cend(); ++it) {
            subq.emplace_back(transform(**it));
        }

        return Query(counti, std::move(subq));
    }
    if (n.is<expression>()) {
        if (n.children.size() == 1) {
            return transform(*n.children[0]);
        }

        auto &expr = n.children[1];
        if (expr->is<op_or>()) {
            std::vector<Query> opts;
            opts.emplace_back(transform(*n.children[0]));
            opts.emplace_back(transform(*n.children[2]));
            return Query(QueryType::OR, std::move(opts));
        }
        if (expr->is<op_and>()) {
            std::vector<Query> opts;
            opts.emplace_back(transform(*n.children[0]));
            opts.emplace_back(transform(*n.children[2]));
            return Query(QueryType::AND, std::move(opts));
        }
        throw std::runtime_error("encountered unexpected expression");
    }
    throw std::runtime_error("encountered unexpected node");
}